

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__malloc_mad2(int a,int b,int add)

{
  void *pvVar1;
  
  if ((-1 < (b | a)) &&
     (((b == 0 || (a <= (int)(0x7fffffff / (ulong)(uint)b))) && (b * a <= (int)(add ^ 0x7fffffffU)))
     )) {
    pvVar1 = malloc((long)(b * a + add));
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__malloc_mad2(int a, int b, int add)
{
   if (!stbi__mad2sizes_valid(a, b, add)) return NULL;
   return stbi__malloc(a*b + add);
}